

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_generator_next(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,
                         int magic)

{
  undefined8 *puVar1;
  long lVar2;
  JSValue obj;
  JSValue v;
  JSValue obj_00;
  int iVar3;
  uint *puVar4;
  JSValueUnion JVar5;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValue *in_R8;
  undefined4 *in_R9;
  JSValue JVar6;
  int in_stack_00000008;
  JSValue func_ret;
  JSValue ret;
  JSStackFrame *sf;
  JSGeneratorData *s;
  JSGeneratorData *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int64_t in_stack_fffffffffffffec0;
  int64_t local_138;
  JSValueUnion local_120;
  int64_t local_118;
  JSValueUnion local_110;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  uint uStack_ec;
  uint uStack_dc;
  JSValueUnion local_a0;
  int64_t local_98;
  int local_90;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar6.tag = in_RDX;
  JVar6.u.float64 = in_RSI.float64;
  puVar4 = (uint *)JS_GetOpaque(JVar6,0x28);
  *in_R9 = 1;
  if (puVar4 == (uint *)0x0) {
    JVar6 = JS_ThrowTypeError(in_RDI,"not a generator");
    return JVar6;
  }
  JVar5._4_4_ = 0;
  JVar5.int32 = *puVar4;
  switch(JVar5) {
  default:
    if (in_stack_00000008 == 0) {
LAB_001be807:
      puVar4[7] = 0;
      goto LAB_001be816;
    }
    free_generator_stack
              ((JSContext *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    break;
  case (JSValueUnion)0x1:
  case (JSValueUnion)0x2:
    JVar6 = JS_DupValue(in_RDI,*in_R8);
    local_a0 = JVar6.u;
    local_98 = JVar6.tag;
    if ((in_stack_00000008 != 2) || (*puVar4 != 1)) {
      lVar2 = *(long *)(puVar4 + 0x1a);
      *(JSValueUnion *)(lVar2 + -0x10) = local_a0;
      *(int64_t *)(lVar2 + -8) = local_98;
      puVar1 = *(undefined8 **)(puVar4 + 0x1a);
      *puVar1 = CONCAT44(uStack_c,in_stack_00000008);
      puVar1[1] = 0;
      *(long *)(puVar4 + 0x1a) = *(long *)(puVar4 + 0x1a) + 0x10;
      goto LAB_001be807;
    }
    obj.tag = in_stack_fffffffffffffec0;
    obj.u.ptr = JVar5.ptr;
    JS_Throw((JSContext *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),obj);
    puVar4[7] = 1;
LAB_001be816:
    *puVar4 = 3;
    JVar6 = async_func_resume((JSContext *)
                              CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                              (JSAsyncFunctionState *)local_110);
    local_90 = JVar6.u._0_4_;
    *puVar4 = 1;
    iVar3 = JS_IsException(JVar6);
    if (iVar3 != 0) {
      free_generator_stack
                ((JSContext *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8);
      return JVar6;
    }
    if ((int)JVar6.tag == 0) {
      local_120 = (JSValueUnion)((JSValueUnion *)(*(long *)(puVar4 + 0x1a) + -0x10))->ptr;
      local_138 = *(int64_t *)(*(long *)(puVar4 + 0x1a) + -8);
      lVar2 = *(long *)(puVar4 + 0x1a);
      *(ulong *)(lVar2 + -0x10) = (ulong)uStack_dc << 0x20;
      *(undefined8 *)(lVar2 + -8) = 3;
      if (local_90 == 2) {
        *puVar4 = 2;
        *in_R9 = 2;
      }
      else {
        *in_R9 = 0;
      }
    }
    else {
      local_120 = (JSValueUnion)((JSValueUnion *)(*(long *)(puVar4 + 0x1a) + -0x10))->ptr;
      local_138 = *(int64_t *)(*(long *)(puVar4 + 0x1a) + -8);
      lVar2 = *(long *)(puVar4 + 0x1a);
      *(ulong *)(lVar2 + -0x10) = (ulong)uStack_ec << 0x20;
      *(undefined8 *)(lVar2 + -8) = 3;
      v.tag = in_stack_fffffffffffffec0;
      v.u.float64 = JVar5.float64;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),v);
      free_generator_stack
                ((JSContext *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8);
    }
    goto LAB_001beb40;
  case (JSValueUnion)0x3:
    JVar6 = JS_ThrowTypeError(in_RDI,"cannot invoke a running generator");
    local_120 = JVar6.u;
    local_138 = JVar6.tag;
    goto LAB_001beb40;
  case (JSValueUnion)0x4:
  }
  if (in_stack_00000008 != 0) {
    if (in_stack_00000008 == 1) {
      JVar6 = JS_DupValue(in_RDI,*in_R8);
      local_110 = JVar6.u;
      local_138 = JVar6.tag;
      local_120 = local_110;
      goto LAB_001beb40;
    }
    if (in_stack_00000008 == 2) {
      JS_DupValue(in_RDI,*in_R8);
      obj_00.tag = in_stack_fffffffffffffec0;
      obj_00.u.float64 = JVar5.float64;
      JVar6 = JS_Throw((JSContext *)CONCAT44(in_stack_00000008,in_stack_fffffffffffffeb0),obj_00);
      local_120 = JVar6.u;
      local_118 = JVar6.tag;
      local_138 = local_118;
      goto LAB_001beb40;
    }
  }
  local_120.ptr = (void *)((ulong)in_stack_ffffffffffffff04 << 0x20);
  local_138 = 3;
LAB_001beb40:
  local_28 = local_138;
  local_30.float64 = local_120.float64;
  return _local_30;
}

Assistant:

static JSValue js_generator_next(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 BOOL *pdone, int magic)
{
    JSGeneratorData *s = JS_GetOpaque(this_val, JS_CLASS_GENERATOR);
    JSStackFrame *sf;
    JSValue ret, func_ret;

    *pdone = TRUE;
    if (!s)
        return JS_ThrowTypeError(ctx, "not a generator");
    sf = &s->func_state.frame;
    switch(s->state) {
    default:
    case JS_GENERATOR_STATE_SUSPENDED_START:
        if (magic == GEN_MAGIC_NEXT) {
            goto exec_no_arg;
        } else {
            free_generator_stack(ctx, s);
            goto done;
        }
        break;
    case JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR:
    case JS_GENERATOR_STATE_SUSPENDED_YIELD:
        /* cur_sp[-1] was set to JS_UNDEFINED in the previous call */
        ret = JS_DupValue(ctx, argv[0]);
        if (magic == GEN_MAGIC_THROW &&
            s->state == JS_GENERATOR_STATE_SUSPENDED_YIELD) {
            JS_Throw(ctx, ret);
            s->func_state.throw_flag = TRUE;
        } else {
            sf->cur_sp[-1] = ret;
            sf->cur_sp[0] = JS_NewInt32(ctx, magic);
            sf->cur_sp++;
        exec_no_arg:
            s->func_state.throw_flag = FALSE;
        }
        s->state = JS_GENERATOR_STATE_EXECUTING;
        func_ret = async_func_resume(ctx, &s->func_state);
        s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD;
        if (JS_IsException(func_ret)) {
            /* finalize the execution in case of exception */
            free_generator_stack(ctx, s);
            return func_ret;
        }
        if (JS_VALUE_GET_TAG(func_ret) == JS_TAG_INT) {
            /* get the returned yield value at the top of the stack */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            if (JS_VALUE_GET_INT(func_ret) == FUNC_RET_YIELD_STAR) {
                s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR;
                /* return (value, done) object */
                *pdone = 2;
            } else {
                *pdone = FALSE;
            }
        } else {
            /* end of iterator */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            JS_FreeValue(ctx, func_ret);
            free_generator_stack(ctx, s);
        }
        break;
    case JS_GENERATOR_STATE_COMPLETED:
    done:
        /* execution is finished */
        switch(magic) {
        default:
        case GEN_MAGIC_NEXT:
            ret = JS_UNDEFINED;
            break;
        case GEN_MAGIC_RETURN:
            ret = JS_DupValue(ctx, argv[0]);
            break;
        case GEN_MAGIC_THROW:
            ret = JS_Throw(ctx, JS_DupValue(ctx, argv[0]));
            break;
        }
        break;
    case JS_GENERATOR_STATE_EXECUTING:
        ret = JS_ThrowTypeError(ctx, "cannot invoke a running generator");
        break;
    }
    return ret;
}